

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_connect.cpp
# Opt level: O0

void __thiscall tst_helpers_connect::rejectOneSenderNoArg(tst_helpers_connect *this)

{
  bool bVar1;
  bool local_7e;
  bool local_7d;
  bool local_7c;
  bool local_7b;
  bool local_7a;
  bool local_79 [7];
  bool local_72;
  bool local_71;
  code *local_70;
  undefined8 local_68;
  code *local_60;
  undefined8 local_58;
  undefined1 local_50 [8];
  PromiseFromSignal<void_(Object::*)(const_QString_&)> p;
  type local_30;
  undefined1 local_28 [8];
  Object sender;
  tst_helpers_connect *this_local;
  
  sender._16_8_ = this;
  Object::Object((Object *)local_28);
  local_30.sender = (Object *)local_28;
  QtPromisePrivate::qtpromise_defer<tst_helpers_connect::rejectOneSenderNoArg()::__0>(&local_30);
  local_60 = Object::oneArgSignal;
  local_58 = 0;
  local_70 = Object::noArgSignal;
  local_68 = 0;
  QtPromise::connect<Object,void(Object::*)(QString_const&),void(Object::*)()>
            ((QtPromise *)local_50,(Object *)local_28,0x1346c0,0);
  local_71 = Object::hasConnections((Object *)local_28);
  local_72 = true;
  bVar1 = QTest::qCompare<bool,bool>
                    (&local_71,&local_72,"sender.hasConnections()","true",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_connect.cpp"
                     ,0x5e);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_79[0] = QtPromise::QPromiseBase<QString>::isPending((QPromiseBase<QString> *)local_50);
    local_7a = true;
    bVar1 = QTest::qCompare<bool,bool>
                      (local_79,&local_7a,"p.isPending()","true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_connect.cpp"
                       ,0x5f);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      local_7b = waitForRejected<QtPromise::QPromiseUndefinedException,QtPromise::QPromise<QString>>
                           ((QPromise<QString> *)local_50);
      local_7c = true;
      bVar1 = QTest::qCompare<bool,bool>
                        (&local_7b,&local_7c,
                         "waitForRejected<QtPromise::QPromiseUndefinedException>(p)","true",
                         "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_connect.cpp"
                         ,0x60);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        local_7d = Object::hasConnections((Object *)local_28);
        local_7e = false;
        bVar1 = QTest::qCompare<bool,bool>
                          (&local_7d,&local_7e,"sender.hasConnections()","false",
                           "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_connect.cpp"
                           ,0x61);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          local_79[1] = false;
          local_79[2] = false;
          local_79[3] = false;
          local_79[4] = false;
        }
        else {
          local_79[1] = true;
          local_79[2] = false;
          local_79[3] = false;
          local_79[4] = false;
        }
      }
      else {
        local_79[1] = true;
        local_79[2] = false;
        local_79[3] = false;
        local_79[4] = false;
      }
    }
    else {
      local_79[1] = true;
      local_79[2] = false;
      local_79[3] = false;
      local_79[4] = false;
    }
  }
  else {
    local_79[1] = true;
    local_79[2] = false;
    local_79[3] = false;
    local_79[4] = false;
  }
  QtPromise::QPromise<QString>::~QPromise((QPromise<QString> *)local_50);
  Object::~Object((Object *)local_28);
  return;
}

Assistant:

void tst_helpers_connect::rejectOneSenderNoArg()
{
    Object sender;
    QtPromisePrivate::qtpromise_defer([&]() {
        Q_EMIT sender.noArgSignal();
    });

    auto p = QtPromise::connect(&sender, &Object::oneArgSignal, &Object::noArgSignal);
    Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<QString>>::value));
    QCOMPARE(sender.hasConnections(), true);
    QCOMPARE(p.isPending(), true);
    QCOMPARE(waitForRejected<QtPromise::QPromiseUndefinedException>(p), true);
    QCOMPARE(sender.hasConnections(), false);
}